

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O1

Board * board_dup(Board *board)

{
  byte bVar1;
  Board *pBVar2;
  Spot **ppSVar3;
  Spot *pSVar4;
  void *pvVar5;
  ulong uVar6;
  
  pBVar2 = (Board *)malloc(0x18);
  pBVar2->spotsCount = '\0';
  pBVar2->spots = (Spot **)0x0;
  pBVar2->gameState = (void *)0x0;
  bVar1 = board->spotsCount;
  if (bVar1 != 0) {
    ppSVar3 = (Spot **)malloc((ulong)bVar1 << 3);
    pBVar2->spots = ppSVar3;
    pBVar2->spotsCount = bVar1;
    if (board->spotsCount != '\0') {
      uVar6 = 0;
      do {
        pSVar4 = spot_dup(board->spots[uVar6]);
        ppSVar3[uVar6] = pSVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < board->spotsCount);
    }
  }
  if ((board->gameState != (void *)0x0) &&
     ((gConfig.game)->dupGameState != (_func_void_ptr_Board_ptr *)0x0)) {
    pvVar5 = (*(gConfig.game)->dupGameState)(board);
    pBVar2->gameState = pvVar5;
  }
  return pBVar2;
}

Assistant:

Board * board_dup(Board * board)
{
	unsigned char i;
	Board * dupBoard = board_create();
	if(board->spotsCount>0)
	{
		dupBoard->spots = (Spot **)malloc(sizeof(Spot *)*board->spotsCount);
		dupBoard->spotsCount = board->spotsCount;
		for(i=0;i<board->spotsCount;i++)
		{
			dupBoard->spots[i] = spot_dup(board->spots[i]);
		}
	}
	if(board->gameState!=0 && gConfig.game->dupGameState!=0)
		dupBoard->gameState = gConfig.game->dupGameState(board);

	return dupBoard;
}